

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

String * __thiscall
kj::anon_unknown_0::NetworkAddressImpl::toString
          (String *__return_storage_ptr__,NetworkAddressImpl *this)

{
  size_t capacity;
  undefined8 *puVar1;
  long lVar2;
  undefined8 *puVar3;
  SocketAddress *this_00;
  ArrayBuilder<kj::String> builder;
  Array<kj::String> result;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *local_58;
  long lStack_50;
  undefined8 *local_48;
  String local_38;
  
  capacity = (this->addrs).size_;
  puVar3 = (undefined8 *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  puVar5 = puVar3 + capacity * 3;
  puVar4 = puVar3;
  if ((this->addrs).size_ != 0) {
    this_00 = (this->addrs).ptr;
    do {
      SocketAddress::toString(&local_38,this_00);
      *puVar4 = local_38.content.ptr;
      puVar4[1] = local_38.content.size_;
      puVar4[2] = local_38.content.disposer;
      puVar4 = puVar4 + 3;
      this_00 = this_00 + 1;
    } while (this_00 != (this->addrs).ptr + (this->addrs).size_);
  }
  lStack_50 = ((long)puVar4 - (long)puVar3 >> 3) * -0x5555555555555555;
  local_48 = &kj::_::HeapArrayDisposer::instance;
  local_58 = puVar3;
  strArray<kj::Array<kj::String>>
            (__return_storage_ptr__,(kj *)&local_58,(Array<kj::String> *)0x4fb640,
             (char *)&kj::_::HeapArrayDisposer::instance);
  lVar2 = lStack_50;
  puVar1 = local_58;
  if (local_58 != (undefined8 *)0x0) {
    local_58 = (undefined8 *)0x0;
    lStack_50 = 0;
    (**(code **)*local_48)
              (local_48,puVar1,0x18,lVar2,lVar2,ArrayDisposer::Dispose_<kj::String>::destruct,puVar3
               ,puVar4,puVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

String toString() override {
    return strArray(KJ_MAP(addr, addrs) { return addr.toString(); }, ",");
  }